

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O3

string_view __thiscall csv::CSVRow::get_field(CSVRow *this,size_t index)

{
  long lVar1;
  ParseFlags PVar2;
  element_type *peVar3;
  tuple<csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_> tVar4;
  char *pcVar5;
  byte bVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  runtime_error *this_00;
  undefined8 uVar9;
  ulong uVar10;
  _Elt_pointer puVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pcVar14;
  string_view sVar15;
  size_t field_index;
  ulong local_38;
  
  if (this->row_length <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Index out of bounds.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = index + this->fields_start;
  peVar3 = (this->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar7 = (peVar3->fields)._single_buffer_capacity;
  puVar11 = ((iterator *)
            ((long)&(peVar3->fields).buffers.
                    super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
                    ._M_impl + 0x10))->_M_cur;
  uVar13 = local_38 % uVar7;
  if (local_38 < uVar7) {
    uVar13 = local_38;
  }
  uVar10 = ((long)puVar11 -
            (long)*(_Elt_pointer *)
                   ((long)&(peVar3->fields).buffers.
                           super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
                           ._M_impl + 0x18) >> 3) + local_38 / uVar7;
  if ((long)uVar10 < 0) {
    uVar7 = (long)uVar10 >> 6;
  }
  else {
    if (uVar10 < 0x40) {
      puVar11 = puVar11 + local_38 / uVar7;
      goto LAB_0010985c;
    }
    uVar7 = uVar10 >> 6;
  }
  puVar11 = (*(_Map_pointer *)
              ((long)&(peVar3->fields).buffers.
                      super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
                      ._M_impl + 0x28))[uVar7] + uVar10 + uVar7 * -0x40;
LAB_0010985c:
  tVar4.
  super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
  .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl =
       (puVar11->_M_t).
       super___uniq_ptr_impl<csv::internals::RawCSVField,_std::default_delete<csv::internals::RawCSVField[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
  ;
  uVar7 = (peVar3->data)._M_len;
  uVar12 = *(long *)((long)tVar4.
                           super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
                           .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl
                    + uVar13 * 0x18) + this->data_start;
  uVar10 = uVar7 - uVar12;
  if (uVar7 < uVar12) {
    uVar9 = std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar12);
    __cxa_free_exception(this);
    _Unwind_Resume(uVar9);
  }
  lVar1 = (long)tVar4.
                super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
                .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl +
          uVar13 * 0x18;
  pcVar5 = (peVar3->data)._M_str;
  if (*(char *)(lVar1 + 0x10) == '\x01') {
    pmVar8 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&peVar3->double_quote_fields,&local_38);
    uVar7 = pmVar8->_M_string_length;
    if (uVar7 == 0) {
      uVar7 = *(ulong *)(lVar1 + 8);
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar13 = 0;
        bVar6 = 0;
        do {
          PVar2 = (((this->data).
                    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->parse_flags)._M_elems[(long)pcVar5[uVar13 + uVar12] + 0x80];
          if ((bool)(PVar2 == QUOTE & bVar6)) {
            bVar6 = 0;
          }
          else {
            bVar6 = PVar2 == QUOTE | bVar6;
            std::__cxx11::string::push_back((char)pmVar8);
            uVar7 = *(ulong *)(lVar1 + 8);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar7);
        uVar7 = pmVar8->_M_string_length;
      }
    }
    pcVar14 = (pmVar8->_M_dataplus)._M_p;
  }
  else {
    pcVar14 = pcVar5 + uVar12;
    uVar7 = *(ulong *)(lVar1 + 8);
    if (uVar10 < *(ulong *)(lVar1 + 8)) {
      uVar7 = uVar10;
    }
  }
  sVar15._M_str = pcVar14;
  sVar15._M_len = uVar7;
  return sVar15;
}

Assistant:

CSV_INLINE csv::string_view CSVRow::get_field(size_t index) const
    {
        using internals::ParseFlags;

        if (index >= this->size())
            throw std::runtime_error("Index out of bounds.");

        const size_t field_index = this->fields_start + index;
        auto& field = this->data->fields[field_index];
        auto field_str = csv::string_view(this->data->data).substr(this->data_start + field.start);

        if (field.has_double_quote) {
            auto& value = this->data->double_quote_fields[field_index];
            if (value.empty()) {
                bool prev_ch_quote = false;
                for (size_t i = 0; i < field.length; i++) {
                    if (this->data->parse_flags[field_str[i] + 128] == ParseFlags::QUOTE) {
                        if (prev_ch_quote) {
                            prev_ch_quote = false;
                            continue;
                        }
                        else {
                            prev_ch_quote = true;
                        }
                    }

                    value += field_str[i];
                }
            }

            return csv::string_view(value);
        }

        return field_str.substr(0, field.length);
    }